

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_sig.c
# Opt level: O0

int rsa_verify(void *vprsactx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  int iVar1;
  char *func;
  uchar *in_RCX;
  size_t in_RDX;
  uchar *in_RSI;
  size_t in_RDI;
  char *in_R8;
  uchar *unaff_retaddr;
  size_t mdsize;
  int ret;
  size_t rslen;
  PROV_RSA_CTX_conflict1 *prsactx;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  char *in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffbc;
  char *in_stack_ffffffffffffffc0;
  int flen;
  size_t routsize;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  routsize = in_RDI;
  iVar1 = ossl_prov_is_running();
  if (iVar1 == 0) {
    return 0;
  }
  if (*(long *)(in_RDI + 0x20) == 0) {
    iVar1 = setup_tbuf((PROV_RSA_CTX_conflict1 *)
                       CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    if (iVar1 == 0) {
      return 0;
    }
    iVar1 = RSA_public_decrypt((int)in_RDX,in_RSI,*(uchar **)(in_RDI + 0xb8),
                               *(RSA **)(in_RDI + 0x10),*(int *)(in_RDI + 0x68));
    in_stack_ffffffffffffffc0 = (char *)(long)iVar1;
    if (in_stack_ffffffffffffffc0 == (char *)0x0) {
      ERR_new();
      ERR_set_debug(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb0);
      ERR_set_error(0x39,0x80004,(char *)0x0);
      return 0;
    }
  }
  else {
    iVar1 = *(int *)(in_RDI + 0x68);
    if (iVar1 == 1) {
      iVar1 = RSA_verify(*(int *)(in_RDI + 0x30),in_RCX,(uint)in_R8,in_RSI,(uint)in_RDX,
                         *(RSA **)(in_RDI + 0x10));
      if (iVar1 == 0) {
        ERR_new();
        ERR_set_debug(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb0)
        ;
        ERR_set_error(0x39,0x80004,(char *)0x0);
        return 0;
      }
      return 1;
    }
    if (iVar1 != 5) {
      if (iVar1 != 6) {
        ERR_new();
        ERR_set_debug(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb0)
        ;
        ERR_set_error(0x39,0xa8,"Only X.931, PKCS#1 v1.5 or PSS padding allowed");
        return 0;
      }
      func = (char *)rsa_get_md_size((PROV_RSA_CTX_conflict1 *)CONCAT44(6,in_stack_ffffffffffffffa8)
                                    );
      flen = (int)in_RDX;
      if (in_R8 != func) {
        ERR_new();
        ERR_set_debug(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,func);
        ERR_set_error(0x39,0xa6,"Should be %d, but got %d",func,in_R8);
        return 0;
      }
      iVar1 = setup_tbuf((PROV_RSA_CTX_conflict1 *)CONCAT44(iVar1,in_stack_ffffffffffffffa8));
      if (iVar1 == 0) {
        return 0;
      }
      iVar1 = RSA_public_decrypt(flen,in_RSI,*(uchar **)(in_RDI + 0xb8),*(RSA **)(in_RDI + 0x10),3);
      if (iVar1 < 1) {
        ERR_new();
        ERR_set_debug(in_stack_ffffffffffffffc0,iVar1,func);
        ERR_set_error(0x39,0x80004,(char *)0x0);
        return 0;
      }
      iVar1 = RSA_verify_PKCS1_PSS_mgf1
                        (*(RSA **)(in_RDI + 0x10),in_RCX,*(EVP_MD **)(in_RDI + 0x20),
                         *(EVP_MD **)(in_RDI + 0x70),*(uchar **)(in_RDI + 0xb8),
                         *(int *)(in_RDI + 0xb0));
      if (iVar1 < 1) {
        ERR_new();
        ERR_set_debug(in_stack_ffffffffffffffc0,iVar1,func);
        ERR_set_error(0x39,0x80004,(char *)0x0);
        return 0;
      }
      return 1;
    }
    iVar1 = setup_tbuf((PROV_RSA_CTX_conflict1 *)CONCAT44(5,in_stack_ffffffffffffffa8));
    if (iVar1 == 0) {
      return 0;
    }
    iVar1 = rsa_verify_recover((void *)mdsize,unaff_retaddr,
                               (size_t *)
                               CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                               routsize,in_RSI,in_RDX);
    if (iVar1 < 1) {
      return 0;
    }
  }
  if ((in_stack_ffffffffffffffc0 == in_R8) &&
     (iVar1 = memcmp(in_RCX,*(void **)(in_RDI + 0xb8),(size_t)in_stack_ffffffffffffffc0), iVar1 == 0
     )) {
    iVar1 = 1;
  }
  else {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int rsa_verify(void *vprsactx, const unsigned char *sig, size_t siglen,
                      const unsigned char *tbs, size_t tbslen)
{
    PROV_RSA_CTX *prsactx = (PROV_RSA_CTX *)vprsactx;
    size_t rslen;

    if (!ossl_prov_is_running())
        return 0;
    if (prsactx->md != NULL) {
        switch (prsactx->pad_mode) {
        case RSA_PKCS1_PADDING:
            if (!RSA_verify(prsactx->mdnid, tbs, tbslen, sig, siglen,
                            prsactx->rsa)) {
                ERR_raise(ERR_LIB_PROV, ERR_R_RSA_LIB);
                return 0;
            }
            return 1;
        case RSA_X931_PADDING:
            if (!setup_tbuf(prsactx))
                return 0;
            if (rsa_verify_recover(prsactx, prsactx->tbuf, &rslen, 0,
                                   sig, siglen) <= 0)
                return 0;
            break;
        case RSA_PKCS1_PSS_PADDING:
            {
                int ret;
                size_t mdsize;

                /*
                 * We need to check this for the RSA_verify_PKCS1_PSS_mgf1()
                 * call
                 */
                mdsize = rsa_get_md_size(prsactx);
                if (tbslen != mdsize) {
                    ERR_raise_data(ERR_LIB_PROV, PROV_R_INVALID_DIGEST_LENGTH,
                                   "Should be %d, but got %d",
                                   mdsize, tbslen);
                    return 0;
                }

                if (!setup_tbuf(prsactx))
                    return 0;
                ret = RSA_public_decrypt(siglen, sig, prsactx->tbuf,
                                         prsactx->rsa, RSA_NO_PADDING);
                if (ret <= 0) {
                    ERR_raise(ERR_LIB_PROV, ERR_R_RSA_LIB);
                    return 0;
                }
                ret = RSA_verify_PKCS1_PSS_mgf1(prsactx->rsa, tbs,
                                                prsactx->md, prsactx->mgf1_md,
                                                prsactx->tbuf,
                                                prsactx->saltlen);
                if (ret <= 0) {
                    ERR_raise(ERR_LIB_PROV, ERR_R_RSA_LIB);
                    return 0;
                }
                return 1;
            }
        default:
            ERR_raise_data(ERR_LIB_PROV, PROV_R_INVALID_PADDING_MODE,
                           "Only X.931, PKCS#1 v1.5 or PSS padding allowed");
            return 0;
        }
    } else {
        if (!setup_tbuf(prsactx))
            return 0;
        rslen = RSA_public_decrypt(siglen, sig, prsactx->tbuf, prsactx->rsa,
                                   prsactx->pad_mode);
        if (rslen == 0) {
            ERR_raise(ERR_LIB_PROV, ERR_R_RSA_LIB);
            return 0;
        }
    }

    if ((rslen != tbslen) || memcmp(tbs, prsactx->tbuf, rslen))
        return 0;

    return 1;
}